

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

wstring * __thiscall
mjs::parser::get_identifier_name_abi_cxx11_
          (wstring *__return_storage_ptr__,parser *this,char *func,int line)

{
  token_type tVar1;
  wstring *pwVar2;
  ostream *poVar3;
  runtime_error *this_00;
  undefined4 in_register_0000000c;
  token_type t;
  string asStack_1e8 [32];
  token local_1c8;
  ostringstream oss;
  
  accept((parser *)&oss,(int)this,(sockaddr *)0x2,(socklen_t *)CONCAT44(in_register_0000000c,line));
  if (_oss == eof) {
    if (((int)this->version_ < 2) ||
       (tVar1 = (this->current_token_).type_, 0x3c < tVar1 - abstract_)) {
      token::destroy((token *)&oss);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar3 = std::operator<<((ostream *)&oss,"Expected identifier name in ");
      poVar3 = std::operator<<(poVar3,func);
      poVar3 = std::operator<<(poVar3," line ");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,line);
      poVar3 = std::operator<<(poVar3," got ");
      mjs::operator<<(poVar3,&this->current_token_);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,asStack_1e8);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    get_token(&local_1c8,this);
    token::destroy(&local_1c8);
    token_string_abi_cxx11_(__return_storage_ptr__,(mjs *)(ulong)tVar1,t);
  }
  else {
    pwVar2 = token::text_abi_cxx11_((token *)&oss);
    std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__,(wstring *)pwVar2);
  }
  token::destroy((token *)&oss);
  return __return_storage_ptr__;
}

Assistant:

std::wstring parser::get_identifier_name(const char* func, int line) {
    if (auto id = accept(token_type::identifier)) {
        return id.text();
    } else if (version_ >= version::es5) {
        // In ES5+ IdentifierName is used in various grammars
        // This means reserved words can be used as identifiers in certain contexts (e.g. Left-Hand-Side and Object Initialiser Expressions)
        switch (const auto t = current_token_type()) {
#define CASE_KEYWORD(tt, ...) case token_type::tt##_:
            MJS_KEYWORDS(CASE_KEYWORD);
#undef CASE_KEYWORD
            {
                get_token(); // Advance to next token
                return token_string(t);
            }
        default:
            break;
        }
    }

    std::ostringstream oss;
    oss << "Expected identifier name in " << func << " line " << line << " got " << current_token();
    throw std::runtime_error(oss.str());
}